

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O1

ssh_keyalg * opensshcert_related_alg(ssh_keyalg *self,ssh_keyalg *base)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if ((*(ssh_keyalg **)((long)opensshcert_all_keyalgs + lVar1))->base_alg == base) {
      return *(ssh_keyalg **)((long)opensshcert_all_keyalgs + lVar1);
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x40);
  return self;
}

Assistant:

static const ssh_keyalg *opensshcert_related_alg(const ssh_keyalg *self,
                                                 const ssh_keyalg *base)
{
    for (size_t i = 0; i < lenof(opensshcert_all_keyalgs); i++) {
        const ssh_keyalg *alg_i = opensshcert_all_keyalgs[i];
        if (base == alg_i->base_alg)
            return alg_i;
    }

    return self;
}